

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QMdiArea::closeActiveSubWindow(QMdiArea *this)

{
  long lVar1;
  bool bVar2;
  int in_ESI;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x388));
  if (bVar2) {
    QWidget::close(*(QWidget **)(lVar1 + 0x390),in_ESI);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }